

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall
OpenMesh::PropertyT<unsigned_int>::PropertyT
          (PropertyT<unsigned_int> *this,PropertyT<unsigned_int> *_rhs)

{
  PropertyT<unsigned_int> *_rhs_local;
  PropertyT<unsigned_int> *this_local;
  
  BaseProperty::BaseProperty(&this->super_BaseProperty,&_rhs->super_BaseProperty);
  (this->super_BaseProperty)._vptr_BaseProperty = (_func_int **)&PTR__PropertyT_003de520;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->data_,&_rhs->data_);
  return;
}

Assistant:

PropertyT(const PropertyT & _rhs)
      : BaseProperty( _rhs ), data_( _rhs.data_ ) {}